

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O0

Aig_CMan_t * Aig_CManStart(int nIns,int nNodes,int nOuts)

{
  Aig_CMan_t *__s;
  Aig_CMan_t *p;
  int nOuts_local;
  int nNodes_local;
  int nIns_local;
  
  __s = (Aig_CMan_t *)malloc((long)((nNodes * 2 + nOuts) * 2) + 0x28);
  memset(__s,0,0x28);
  __s->nIns = nIns;
  __s->nOuts = nOuts;
  __s->nNodes = nNodes;
  __s->nBytes = (nNodes * 2 + nOuts) * 2;
  __s->iNode = __s->nIns + 1;
  __s->iPrev = -1;
  __s->pCur = (uchar *)(__s + 1);
  return __s;
}

Assistant:

Aig_CMan_t * Aig_CManStart( int nIns, int nNodes, int nOuts )
{
    Aig_CMan_t * p;
    p = (Aig_CMan_t *)ABC_ALLOC( char, sizeof(Aig_CMan_t) + 2*(2*nNodes + nOuts) );
    memset( p, 0, sizeof(Aig_CMan_t) );
    // set parameters
    p->nIns = nIns;
    p->nOuts = nOuts;
    p->nNodes = nNodes;
    p->nBytes = 2*(2*nNodes + nOuts);
    // prepare the manager
    p->iNode = 1 + p->nIns;
    p->iPrev = -1;
    p->pCur = p->Data;
    return p;
}